

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O2

void SetNewArrayElements(ParseNode *pnode,RegSlot arrayLocation,ByteCodeGenerator *byteCodeGenerator
                        ,FuncInfo *funcInfo)

{
  ByteCodeWriter *this;
  uint rhs;
  uint argCount;
  code *pcVar1;
  bool bVar2;
  int iVar3;
  RegSlot RVar4;
  uint32 uVar5;
  RegSlot RVar6;
  ParseNodeUni *pPVar7;
  ParseNodeArrLit *pPVar8;
  undefined7 extraout_var;
  AuxArray<int> *obj;
  AuxArray<double> *obj_00;
  AuxArray<void_*> *obj_01;
  undefined4 *puVar9;
  ParseNodeBin *pPVar10;
  ByteCodeGenerator *pBVar11;
  uint uVar12;
  ulong uVar13;
  ParseNode *args;
  OpCode op;
  RegSlot RVar14;
  bool bVar15;
  AuxArray<unsigned_int> *local_68;
  uint local_4c;
  uint spreadIndex;
  int32 local_40;
  int32 local_3c;
  int auxSize;
  int extraAlloc;
  
  pPVar7 = ParseNode::AsParseNodeUni(pnode);
  args = pPVar7->pnode1;
  pPVar8 = ParseNode::AsParseNodeArrLit(pnode);
  argCount = pPVar8->count;
  pPVar8 = ParseNode::AsParseNodeArrLit(pnode);
  uVar12 = pPVar8->spreadCount;
  bVar2 = CreateNativeArrays(byteCodeGenerator,funcInfo);
  if (bVar2) {
    pPVar8 = ParseNode::AsParseNodeArrLit(pnode);
    if ((pPVar8->field_0x20 & 2) != 0) {
      local_3c = 0;
      local_40 = 0;
      bVar2 = Int32Math::Mul(argCount,4,&local_3c);
      if ((bVar2) || (bVar2 = Int32Math::Add(4,local_3c,&local_40), bVar2)) goto LAB_0076ccd4;
      pBVar11 = (ByteCodeGenerator *)&DAT_00000004;
      obj = (AuxArray<int> *)new<Memory::ArenaAllocator>(4,byteCodeGenerator->alloc,0x35916e,0);
      obj->count = argCount;
      EmitConstantArgsToIntArray(pBVar11,(int32 *)(obj + 1),args,argCount);
      pPVar8 = ParseNode::AsParseNodeArrLit(pnode);
      if ((pPVar8->field_0x20 & 8) == 0) {
LAB_0076c694:
        Js::ByteCodeWriter::Auxiliary
                  (&byteCodeGenerator->m_writer,NewScIntArray,pnode->location,obj,local_40,argCount)
        ;
        Memory::
        DeleteObject<Memory::ArenaAllocator,(Memory::AllocatorDeleteFlags)0,Js::AuxArray<int>>
                  (byteCodeGenerator->alloc,obj,(long)local_3c);
        return;
      }
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar9 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                         ,0x23a6,"(!pnode->AsParseNodeArrLit()->hasMissingValues)",
                         "!pnode->AsParseNodeArrLit()->hasMissingValues");
      if (bVar2) {
        *puVar9 = 0;
        goto LAB_0076c694;
      }
      goto LAB_0076ccd9;
    }
    pPVar8 = ParseNode::AsParseNodeArrLit(pnode);
    if ((pPVar8->field_0x20 & 4) != 0) {
      local_3c = 0;
      local_40 = 0;
      bVar2 = Int32Math::Mul(argCount,8,&local_3c);
      if ((!bVar2) && (bVar2 = Int32Math::Add(8,local_3c,&local_40), !bVar2)) {
        pBVar11 = (ByteCodeGenerator *)0x8;
        obj_00 = (AuxArray<double> *)
                 new<Memory::ArenaAllocator>(8,byteCodeGenerator->alloc,0x35916e,0);
        obj_00->count = argCount;
        EmitConstantArgsToFltArray(pBVar11,(double *)(obj_00 + 1),args,argCount);
        pPVar8 = ParseNode::AsParseNodeArrLit(pnode);
        if ((pPVar8->field_0x20 & 8) != 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar9 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                             ,0x23bc,"(!pnode->AsParseNodeArrLit()->hasMissingValues)",
                             "!pnode->AsParseNodeArrLit()->hasMissingValues");
          if (!bVar2) goto LAB_0076ccd9;
          *puVar9 = 0;
        }
        Js::ByteCodeWriter::Auxiliary
                  (&byteCodeGenerator->m_writer,NewScFltArray,pnode->location,obj_00,local_40,
                   argCount);
        Memory::
        DeleteObject<Memory::ArenaAllocator,(Memory::AllocatorDeleteFlags)0,Js::AuxArray<double>>
                  (byteCodeGenerator->alloc,obj_00,(long)local_3c);
        return;
      }
      goto LAB_0076ccd4;
    }
  }
  pPVar8 = ParseNode::AsParseNodeArrLit(pnode);
  if ((pPVar8->field_0x20 & 1) == 0) {
    iVar3 = 0;
  }
  else {
    pPVar8 = ParseNode::AsParseNodeArrLit(pnode);
    bVar15 = 1 < pPVar8->count;
    iVar3 = (int)CONCAT71((int7)((ulong)pPVar8 >> 8),bVar15);
    if (bVar2 && bVar15) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar9 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                         ,0x23c8,"(!arrayLitOpt || !nativeArrays)","!arrayLitOpt || !nativeArrays");
      if (!bVar2) goto LAB_0076ccd9;
      *puVar9 = 0;
      iVar3 = (int)CONCAT71(extraout_var,1);
    }
  }
  extraAlloc = iVar3;
  if (0x3fffffff < uVar12) {
LAB_0076ccd4:
    Math::DefaultOverflowPolicy();
  }
  rhs = uVar12 * 4;
  pPVar8 = ParseNode::AsParseNodeArrLit(pnode);
  if (pPVar8->spreadCount == 0) {
    local_68 = (AuxArray<unsigned_int> *)0x0;
    auxSize = arrayLocation;
  }
  else {
    RVar4 = FuncInfo::AcquireTmpRegister(funcInfo);
    local_68 = (AuxArray<unsigned_int> *)
               new<Memory::ArenaAllocator>(4,byteCodeGenerator->alloc,0x35916e,0);
    local_68->count = uVar12;
    auxSize = RVar4;
  }
  this = &byteCodeGenerator->m_writer;
  pPVar8 = ParseNode::AsParseNodeArrLit(pnode);
  Js::ByteCodeWriter::Reg1Unsigned1
            (this,(ushort)((pPVar8->field_0x20 & 8) >> 3) * 2 + NewScArray,auxSize,argCount);
  if (args == (ParseNode *)0x0) goto LAB_0076cc59;
  if ((argCount != 1) || (bVar2 = Js::ByteCodeWriter::DoProfileNewScArrayOp(this,NewScArray), bVar2)
     ) {
    if ((char)extraAlloc != '\0') {
      RVar4 = FuncInfo::AcquireTmpRegister(funcInfo);
      Js::ByteCodeWriter::Reg2(this,LdArrHead,RVar4,auxSize);
      if (0x1fffffff < argCount) goto LAB_0076ccd4;
      goto LAB_0076c8ec;
    }
    bVar2 = Js::JavascriptArray::HasInlineHeadSegment(argCount);
    op = StArrInlineItem_CI4;
    RVar4 = auxSize;
    if ((!bVar2) && (op = StArrItemI_CI4, argCount < 0x40001)) {
      RVar4 = FuncInfo::AcquireTmpRegister(funcInfo);
      Js::ByteCodeWriter::Reg2(this,LdArrHead,RVar4,auxSize);
      op = StArrSegItem_CI4;
    }
LAB_0076c972:
    extraAlloc = 0;
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    local_4c = 0;
    while( true ) {
      uVar13 = (ulong)local_4c;
      if (args->nop != knopList) break;
      pPVar10 = ParseNode::AsParseNodeBin(args);
      iVar3 = extraAlloc;
      if (pPVar10->pnode1->nop != knopEmpty) {
        pPVar10 = ParseNode::AsParseNodeBin(args);
        Emit(pPVar10->pnode1,byteCodeGenerator,funcInfo,0,false,false);
        pPVar10 = ParseNode::AsParseNodeBin(args);
        RVar14 = pPVar10->pnode1->location;
        pPVar10 = ParseNode::AsParseNodeBin(args);
        if (pPVar10->pnode1->nop == knopEllipsis) {
          if (local_68 == (AuxArray<unsigned_int> *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar9 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                               ,0x2414,"(spreadIndices)","spreadIndices");
            if (!bVar2) goto LAB_0076ccd9;
            *puVar9 = 0;
          }
          RVar6 = FuncInfo::AcquireTmpRegister(funcInfo);
          Js::ByteCodeWriter::Reg2(this,LdCustomSpreadIteratorList,RVar6,RVar14);
          local_4c = local_4c + 1;
          local_68[uVar13 + 1].count = extraAlloc;
          RVar14 = RVar6;
        }
        iVar3 = extraAlloc;
        Js::ByteCodeWriter::ElementUnsigned1(this,op,RVar14,RVar4,extraAlloc);
        pPVar10 = ParseNode::AsParseNodeBin(args);
        if (pPVar10->pnode1->nop == knopEllipsis) {
          FuncInfo::ReleaseTmpRegister(funcInfo,RVar14);
        }
        pPVar10 = ParseNode::AsParseNodeBin(args);
        FuncInfo::ReleaseLoc(funcInfo,pPVar10->pnode1);
      }
      pPVar10 = ParseNode::AsParseNodeBin(args);
      args = pPVar10->pnode2;
      extraAlloc = iVar3 + 1;
    }
    uVar12 = extraAlloc;
    if (args->nop != knopEmpty) {
      Emit(args,byteCodeGenerator,funcInfo,0,false,false);
      RVar14 = args->location;
      if (args->nop == knopEllipsis) {
        RVar6 = FuncInfo::AcquireTmpRegister(funcInfo);
        Js::ByteCodeWriter::Reg2(this,LdCustomSpreadIteratorList,RVar6,RVar14);
        if (local_68 == (AuxArray<unsigned_int> *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar9 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                             ,0x2431,"(spreadIndices)","spreadIndices");
          if (!bVar2) goto LAB_0076ccd9;
          *puVar9 = 0;
        }
        local_68[uVar13 + 1].count = extraAlloc;
        RVar14 = RVar6;
      }
      iVar3 = extraAlloc;
      Js::ByteCodeWriter::ElementUnsigned1(this,op,RVar14,RVar4,extraAlloc);
      if (args->nop == knopEllipsis) {
        FuncInfo::ReleaseTmpRegister(funcInfo,RVar14);
      }
      FuncInfo::ReleaseLoc(funcInfo,args);
      uVar12 = iVar3 + 1;
    }
    if (argCount < uVar12) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar9 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                         ,0x243f,"(i <= argCount)","i <= argCount");
      if (!bVar2) {
LAB_0076ccd9:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar9 = 0;
    }
  }
  else {
    op = StArrItemC_CI4;
    RVar4 = auxSize;
    if ((char)extraAlloc == '\0') goto LAB_0076c972;
LAB_0076c8ec:
    pBVar11 = (ByteCodeGenerator *)0x8;
    obj_01 = (AuxArray<void_*> *)new<Memory::ArenaAllocator>(8,byteCodeGenerator->alloc,0x35916e,0);
    obj_01->count = argCount;
    EmitConstantArgsToVarArray(pBVar11,(Var *)(obj_01 + 1),args,argCount);
    uVar5 = UInt32Math::Add(8,(uint32)((ulong)argCount * 8));
    Js::ByteCodeWriter::Auxiliary(this,StArrSegItem_A,RVar4,obj_01,uVar5,argCount);
    Memory::DeleteObject<Memory::ArenaAllocator,(Memory::AllocatorDeleteFlags)0,Js::AuxArray<void*>>
              (byteCodeGenerator->alloc,obj_01,(ulong)argCount * 8);
  }
  if (RVar4 != auxSize) {
    FuncInfo::ReleaseTmpRegister(funcInfo,RVar4);
  }
LAB_0076cc59:
  pPVar8 = ParseNode::AsParseNodeArrLit(pnode);
  if (pPVar8->spreadCount == 0) {
    return;
  }
  uVar5 = UInt32Math::Add(4,rhs);
  iVar3 = auxSize;
  Js::ByteCodeWriter::Reg2Aux(this,SpreadArrayLiteral,arrayLocation,auxSize,local_68,uVar5,rhs);
  Memory::
  DeleteObject<Memory::ArenaAllocator,(Memory::AllocatorDeleteFlags)0,Js::AuxArray<unsigned_int>>
            (byteCodeGenerator->alloc,local_68,(ulong)rhs);
  FuncInfo::ReleaseTmpRegister(funcInfo,iVar3);
  return;
}

Assistant:

void SetNewArrayElements(ParseNode *pnode, Js::RegSlot arrayLocation, ByteCodeGenerator *byteCodeGenerator, FuncInfo *funcInfo)
{
    ParseNode *args = pnode->AsParseNodeUni()->pnode1;
    uint argCount = pnode->AsParseNodeArrLit()->count;
    uint spreadCount = pnode->AsParseNodeArrLit()->spreadCount;
    bool nativeArrays = CreateNativeArrays(byteCodeGenerator, funcInfo);

    bool arrayIntOpt = nativeArrays && pnode->AsParseNodeArrLit()->arrayOfInts;
    if (arrayIntOpt)
    {
        int extraAlloc = 0, auxSize = 0;
        if (Int32Math::Mul(argCount, sizeof(int32), &extraAlloc)
            || Int32Math::Add(sizeof(Js::AuxArray<int>), extraAlloc, &auxSize))
        {
            ::Math::DefaultOverflowPolicy();
        }
        Js::AuxArray<int> *ints = AnewPlus(byteCodeGenerator->GetAllocator(), extraAlloc, Js::AuxArray<int32>, argCount);
        EmitConstantArgsToIntArray(byteCodeGenerator, ints->elements, args, argCount);
        Assert(!pnode->AsParseNodeArrLit()->hasMissingValues);
        byteCodeGenerator->Writer()->Auxiliary(
            Js::OpCode::NewScIntArray,
            pnode->location,
            ints,
            auxSize,
            argCount);
        AdeletePlus(byteCodeGenerator->GetAllocator(), extraAlloc, ints);
        return;
    }

    bool arrayNumOpt = nativeArrays && pnode->AsParseNodeArrLit()->arrayOfNumbers;
    if (arrayNumOpt)
    {
        int extraAlloc = 0, auxSize = 0;
        if (Int32Math::Mul(argCount, sizeof(double), &extraAlloc)
            || Int32Math::Add(sizeof(Js::AuxArray<double>), extraAlloc, &auxSize))
        {
            ::Math::DefaultOverflowPolicy();
        }
        Js::AuxArray<double> *doubles = AnewPlus(byteCodeGenerator->GetAllocator(), extraAlloc, Js::AuxArray<double>, argCount);
        EmitConstantArgsToFltArray(byteCodeGenerator, doubles->elements, args, argCount);
        Assert(!pnode->AsParseNodeArrLit()->hasMissingValues);
        byteCodeGenerator->Writer()->Auxiliary(
            Js::OpCode::NewScFltArray,
            pnode->location,
            doubles,
            auxSize,
            argCount);
        AdeletePlus(byteCodeGenerator->GetAllocator(), extraAlloc, doubles);
        return;
    }

    bool arrayLitOpt = pnode->AsParseNodeArrLit()->arrayOfTaggedInts && pnode->AsParseNodeArrLit()->count > 1;
    Assert(!arrayLitOpt || !nativeArrays);

    Js::RegSlot spreadArrLoc = arrayLocation;
    Js::AuxArray<uint32> *spreadIndices = nullptr;
    const uint extraAlloc = UInt32Math::Mul(spreadCount, sizeof(uint32));
    if (pnode->AsParseNodeArrLit()->spreadCount > 0)
    {
        arrayLocation = funcInfo->AcquireTmpRegister();
        spreadIndices = AnewPlus(byteCodeGenerator->GetAllocator(), extraAlloc, Js::AuxArray<uint32>, spreadCount);
    }

    byteCodeGenerator->Writer()->Reg1Unsigned1(
        pnode->AsParseNodeArrLit()->hasMissingValues ? Js::OpCode::NewScArrayWithMissingValues : Js::OpCode::NewScArray,
        arrayLocation,
        argCount);

    if (args != nullptr)
    {
        Js::OpCode opcode;
        Js::RegSlot arrLoc;
        if (argCount == 1 && !byteCodeGenerator->Writer()->DoProfileNewScArrayOp(Js::OpCode::NewScArray))
        {
            opcode = Js::OpCode::StArrItemC_CI4;
            arrLoc = arrayLocation;
        }
        else if (arrayLitOpt)
        {
            opcode = Js::OpCode::StArrSegItem_A;
            arrLoc = funcInfo->AcquireTmpRegister();
            byteCodeGenerator->Writer()->Reg2(Js::OpCode::LdArrHead, arrLoc, arrayLocation);
        }
        else if (Js::JavascriptArray::HasInlineHeadSegment(argCount))
        {
            // The head segment will be allocated inline as an interior pointer. To keep the array alive, the set operation
            // should be done relative to the array header to keep it alive (instead of the array segment).
            opcode = Js::OpCode::StArrInlineItem_CI4;
            arrLoc = arrayLocation;
        }
        else if (argCount <= Js::JavascriptArray::MaxInitialDenseLength)
        {
            opcode = Js::OpCode::StArrSegItem_CI4;
            arrLoc = funcInfo->AcquireTmpRegister();
            byteCodeGenerator->Writer()->Reg2(Js::OpCode::LdArrHead, arrLoc, arrayLocation);
        }
        else
        {
            opcode = Js::OpCode::StArrItemI_CI4;
            arrLoc = arrayLocation;
        }

        if (arrayLitOpt)
        {
            uint32 allocSize = UInt32Math::Mul(argCount, sizeof(Js::Var));
            Js::VarArray *vars = AnewPlus(byteCodeGenerator->GetAllocator(), allocSize, Js::VarArray, argCount);

            EmitConstantArgsToVarArray(byteCodeGenerator, vars->elements, args, argCount);

            // Generate the opcode with vars
            byteCodeGenerator->Writer()->Auxiliary(Js::OpCode::StArrSegItem_A, arrLoc, vars, UInt32Math::Add(sizeof(Js::VarArray), allocSize), argCount);

            AdeletePlus(byteCodeGenerator->GetAllocator(), allocSize, vars);
        }
        else
        {
            uint i = 0;
            unsigned spreadIndex = 0;
            Js::RegSlot rhsLocation;
            while (args->nop == knopList)
            {
                if (args->AsParseNodeBin()->pnode1->nop != knopEmpty)
                {
                    Emit(args->AsParseNodeBin()->pnode1, byteCodeGenerator, funcInfo, false);
                    rhsLocation = args->AsParseNodeBin()->pnode1->location;
                    Js::RegSlot regVal = rhsLocation;
                    if (args->AsParseNodeBin()->pnode1->nop == knopEllipsis)
                    {
                        AnalysisAssert(spreadIndices);
                        regVal = funcInfo->AcquireTmpRegister();
                        byteCodeGenerator->Writer()->Reg2(Js::OpCode::LdCustomSpreadIteratorList, regVal, rhsLocation);
                        spreadIndices->elements[spreadIndex++] = i;
                    }

                    byteCodeGenerator->Writer()->ElementUnsigned1(opcode, regVal, arrLoc, i);

                    if (args->AsParseNodeBin()->pnode1->nop == knopEllipsis)
                    {
                        funcInfo->ReleaseTmpRegister(regVal);
                    }

                    funcInfo->ReleaseLoc(args->AsParseNodeBin()->pnode1);
                }

                args = args->AsParseNodeBin()->pnode2;
                i++;
            }

            if (args->nop != knopEmpty)
            {
                Emit(args, byteCodeGenerator, funcInfo, false);
                rhsLocation = args->location;
                Js::RegSlot regVal = rhsLocation;
                if (args->nop == knopEllipsis)
                {
                    regVal = funcInfo->AcquireTmpRegister();
                    byteCodeGenerator->Writer()->Reg2(Js::OpCode::LdCustomSpreadIteratorList, regVal, rhsLocation);
                    AnalysisAssert(spreadIndices);
                    spreadIndices->elements[spreadIndex] = i;
                }

                byteCodeGenerator->Writer()->ElementUnsigned1(opcode, regVal, arrLoc, i);

                if (args->nop == knopEllipsis)
                {
                    funcInfo->ReleaseTmpRegister(regVal);
                }

                funcInfo->ReleaseLoc(args);
                i++;
            }
            Assert(i <= argCount);
        }

        if (arrLoc != arrayLocation)
        {
            funcInfo->ReleaseTmpRegister(arrLoc);
        }
    }

    if (pnode->AsParseNodeArrLit()->spreadCount > 0)
    {
        byteCodeGenerator->Writer()->Reg2Aux(Js::OpCode::SpreadArrayLiteral, spreadArrLoc, arrayLocation, spreadIndices, UInt32Math::Add(sizeof(Js::AuxArray<uint32>), extraAlloc), extraAlloc);
        AdeletePlus(byteCodeGenerator->GetAllocator(), extraAlloc, spreadIndices);
        funcInfo->ReleaseTmpRegister(arrayLocation);
    }
}